

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::TcpConnection::handleRead(TcpConnection *this,Timestamp receiveTime)

{
  bool bVar1;
  sz_ssize_t sVar2;
  SourceFile file;
  Logger local_1018;
  undefined1 local_48 [12];
  int local_34 [2];
  int savedErrno;
  
  EventLoop::assertInLoopThread(this->m_loop);
  local_34[0] = 0;
LAB_00127bbd:
  sVar2 = Buffer::readvFd(&this->m_inputBuffer,
                          ((this->m_channel)._M_t.
                           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                           .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl)->m_fd,
                          local_34);
  if (sVar2 == -1) goto code_r0x00127bd5;
  goto LAB_00127bdb;
code_r0x00127bd5:
  if (local_34[0] != 4) {
LAB_00127bdb:
    if (sVar2 < 1) {
      if (sVar2 == 0) {
        handleClose(this);
      }
      else {
        bVar1 = sockets::sz_wouldblock();
        if (!bVar1) {
          Logger::SourceFile::SourceFile<104>
                    ((SourceFile *)local_48,
                     (char (*) [104])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                    );
          file._12_4_ = 0;
          file.m_data = (char *)local_48._0_8_;
          file.m_size = local_48._8_4_;
          Logger::Logger(&local_1018,file,0x158,false);
          LogStream::operator<<(&local_1018.m_impl.m_stream,"TcpConnection::handleRead");
          Logger::~Logger(&local_1018);
          handleError(this);
          handleClose(this);
        }
        std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<sznet::net::TcpConnection,void>
                  ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_1018
                   ,(__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
        std::
        function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
        ::operator()(&this->m_messageCallback,(shared_ptr<sznet::net::TcpConnection> *)&local_1018,
                     &this->m_inputBuffer,receiveTime);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1018.m_impl.m_stream);
      }
      return;
    }
    (this->m_netStatInfo).m_recvBytes = (this->m_netStatInfo).m_recvBytes + sVar2;
  }
  goto LAB_00127bbd;
}

Assistant:

void TcpConnection::handleRead(Timestamp receiveTime)
{
	m_loop->assertInLoopThread();
	int savedErrno = 0;
	sz_ssize_t n = 0;
	while (true)
	{
		do
		{
			n = m_inputBuffer.readvFd(m_channel->fd(), &savedErrno);
		} while (n == -1 && savedErrno == sz_err_eintr);
		if (n > 0)
		{
			m_netStatInfo.m_recvBytes += n;
		}
		else if (n == 0)
		{
			handleClose();
			return;
		}
		else
		{
			if (!sockets::sz_wouldblock())
			{
				LOG_SYSERR << "TcpConnection::handleRead";
				handleError();
				handleClose();
			}
			// ����ȫ����ȡ����
			break;
		}
	}
	// ��������
	m_messageCallback(shared_from_this(), &m_inputBuffer, receiveTime);
}